

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

string * google::protobuf::compiler::cpp::Formatter::Payload<google::protobuf::OneofDescriptor>
                   (OneofDescriptor *descriptor)

{
  GeneratedCodeInfo_Annotation *this;
  GeneratedCodeInfo_Annotation *pGVar1;
  string *value;
  string *in_RDI;
  int i;
  Annotation annotation;
  vector<int,_std::allocator<int>_> path;
  undefined8 in_stack_ffffffffffffff58;
  string *this_00;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar2;
  MessageLite *in_stack_ffffffffffffff88;
  vector<int,_std::allocator<int>_> local_28;
  
  this_00 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x514c76);
  OneofDescriptor::GetLocationPath
            ((OneofDescriptor *)this_00,(vector<int,_std::allocator<int>_> *)in_RDI);
  GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation
            ((GeneratedCodeInfo_Annotation *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  iVar2 = 0;
  while( true ) {
    this = (GeneratedCodeInfo_Annotation *)(long)iVar2;
    pGVar1 = (GeneratedCodeInfo_Annotation *)std::vector<int,_std::allocator<int>_>::size(&local_28)
    ;
    if (pGVar1 <= this) break;
    std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)iVar2);
    GeneratedCodeInfo_Annotation::add_path(this,(int32)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    iVar2 = iVar2 + 1;
  }
  value = (string *)OneofDescriptor::file((OneofDescriptor *)0x514d28);
  FileDescriptor::name_abi_cxx11_((FileDescriptor *)value);
  GeneratedCodeInfo_Annotation::set_source_file(this,value);
  MessageLite::SerializeAsString_abi_cxx11_(in_stack_ffffffffffffff88);
  GeneratedCodeInfo_Annotation::~GeneratedCodeInfo_Annotation(this);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  return this_00;
}

Assistant:

static std::string Payload(const Descriptor* descriptor) {
    std::vector<int> path;
    descriptor->GetLocationPath(&path);
    GeneratedCodeInfo::Annotation annotation;
    for (int i = 0; i < path.size(); ++i) {
      annotation.add_path(path[i]);
    }
    annotation.set_source_file(descriptor->file()->name());
    return annotation.SerializeAsString();
  }